

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

ENetSocket enet_socket_accept(ENetSocket socket,ENetAddress *address)

{
  uint16_t uVar1;
  socklen_t *local_58;
  sockaddr *local_48;
  socklen_t local_3c;
  undefined1 local_38 [4];
  socklen_t sinLength;
  sockaddr_in6 sin;
  int result;
  ENetAddress *address_local;
  ENetSocket socket_local;
  
  sin.sin6_addr.__in6_u.__u6_addr32[3] = 0xffffffff;
  local_3c = 0x1c;
  if (address == (ENetAddress *)0x0) {
    local_48 = (sockaddr *)0x0;
    local_58 = (socklen_t *)0x0;
  }
  else {
    local_48 = (sockaddr *)local_38;
    local_58 = &local_3c;
  }
  unique0x1000008f = address;
  sin.sin6_addr.__in6_u.__u6_addr32[3] = accept(socket,local_48,local_58);
  if (sin.sin6_addr.__in6_u.__u6_addr32[3] == 0xffffffff) {
    address_local._4_4_ = 0xffffffff;
  }
  else {
    if (stack0xffffffffffffffe8 != (ENetAddress *)0x0) {
      *(undefined8 *)&stack0xffffffffffffffe8->field_0 = sin._0_8_;
      *(undefined8 *)((long)&stack0xffffffffffffffe8->field_0 + 8) = sin.sin6_addr.__in6_u._0_8_;
      uVar1 = ntohs(local_38._2_2_);
      stack0xffffffffffffffe8->port = uVar1;
    }
    address_local._4_4_ = sin.sin6_addr.__in6_u.__u6_addr32[3];
  }
  return address_local._4_4_;
}

Assistant:

ENetSocket enet_socket_accept(ENetSocket socket, ENetAddress* address) {
	int result = -1;
	struct sockaddr_in6 sin;
	socklen_t sinLength = sizeof(struct sockaddr_in6);

	result = accept(socket, address != NULL ? (struct sockaddr*)&sin : NULL, address != NULL ? &sinLength : NULL);

	if (result == -1)
		return ENET_SOCKET_NULL;

	if (address != NULL) {
		address->ipv6 = sin.sin6_addr;
		address->port = ENET_NET_TO_HOST_16(sin.sin6_port);
	}

	return result;
}